

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O1

u32 __thiscall moira::Moira::computeEA<(moira::Mode)4,(moira::Size)4,0ul>(Moira *this,u32 n)

{
  if (n < 8) {
    (*this->_vptr_Moira[0x19])(this,2);
    return *(int *)((long)this->exec + (ulong)n * 4 + -0x38) - 4;
  }
  __assert_fail("n < 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/elmerucr[P]E64-II/src/machine/cpu/Moira/MoiraDataflow_cpp.h"
                ,0x4c,
                "u32 moira::Moira::computeEA(u32) [M = moira::MODE_PD, S = moira::Long, F = 0UL]");
}

Assistant:

u32
Moira::computeEA(u32 n) {

    assert(n < 8);

    u32 result;

    switch (M) {

        case 0:  // Dn
        case 1:  // An
        {
            result = n;
            break;
        }
        case 2:  // (An)
        {
            result = readA(n);
            break;
        }
        case 3:  // (An)+
        {
            result = readA(n);
            break;
        }
        case 4:  // -(An)
        {
            sync(2);
            result = readA(n) - ((n == 7 && S == Byte) ? 2 : S);
            break;
        }
        case 5: // (d,An)
        {
            u32 an = readA(n);
            i16  d = (i16)queue.irc;

            result = d + an;
            if ((F & SKIP_LAST_READ) == 0) readExt();
            break;
        }
        case 6: // (d,An,Xi)
        {
            i8   d = (i8)queue.irc;
            u32 an = readA(n);
            u32 xi = readR((queue.irc >> 12) & 0b1111);

            result = d + an + ((queue.irc & 0x800) ? xi : SEXT<Word>(xi));

            sync(2);
            if ((F & SKIP_LAST_READ) == 0) readExt();
            break;
        }
        case 7: // ABS.W
        {
            result = (i16)queue.irc;
            if ((F & SKIP_LAST_READ) == 0) readExt();
            break;
        }
        case 8: // ABS.L
        {
            result = queue.irc << 16;
            readExt();
            result |= queue.irc;
            if ((F & SKIP_LAST_READ) == 0) readExt();
            break;
        }
        case 9: // (d,PC)
        {
            i16  d = (i16)queue.irc;

            result = reg.pc + d;
            if ((F & SKIP_LAST_READ) == 0) readExt();
            break;
        }
        case 10: // (d,PC,Xi)
        {
            i8   d = (i8)queue.irc;
            u32 xi = readR((queue.irc >> 12) & 0b1111);

            result = d + reg.pc + ((queue.irc & 0x800) ? xi : SEXT<Word>(xi));
            sync(2);
            if ((F & SKIP_LAST_READ) == 0) readExt();
            break;
        }
        case 11: // Im
        {
            result = readI<S>();
            break;
        }
        default:
        {
            assert(false);
        }
    }
    return result;
}